

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O1

void G1_mul(G1 *rop,G1 *op,BIGNUM *scalar,ATE_CTX *ctx)

{
  fp_struct_st *src;
  fp_struct_st *dst;
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  BN_CTX *ctx_00;
  BIGNUM *r;
  unsigned_long *puVar5;
  bool bVar6;
  long lVar7;
  BIGNUM *a;
  G1 *pGVar8;
  G1 *pGVar9;
  BIGNUM *pBVar10;
  ulong uVar11;
  bool bVar12;
  byte bVar13;
  G1 *row;
  uchar p_str [33];
  uchar table_storage [2080];
  int local_888 [7];
  byte local_869;
  undefined1 local_840 [1536];
  G1 local_240;
  G1 local_1e0;
  G1 local_180;
  G1 local_120;
  G1 GStack_c0;
  
  bVar13 = 0;
  ctx_00 = BN_CTX_new();
  bVar6 = true;
  pBVar10 = (BIGNUM *)0x0;
  do {
    if (!bVar6) {
      uVar3 = _booth_recode_w5((uint)(local_869 >> 6));
      G1_gather_w5(&local_240,local_840,uVar3 >> 1);
      pGVar8 = &local_240;
      pGVar9 = rop;
      for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
        pGVar9->m_x[0].d[0] = pGVar8->m_x[0].d[0];
        pGVar8 = (G1 *)((long)pGVar8 + (ulong)bVar13 * -0x10 + 8);
        pGVar9 = (G1 *)((long)pGVar9 + (ulong)bVar13 * -0x10 + 8);
      }
      src = local_1e0.m_y;
      dst = local_240.m_y;
      uVar3 = 0xff;
      do {
        if (uVar3 != 0xff) {
          uVar4 = _booth_recode_w5(*(ushort *)((long)local_888 + (ulong)(uVar3 - 1 >> 3)) >>
                                   ((byte)(uVar3 - 1) & 7) & 0x3f);
          G1_gather_w5(&local_240,local_840,uVar4 >> 1);
          fp_neg(src,dst,ctx->p);
          copy_conditional(dst->d,src->d,(ulong)(uVar4 & 1));
          G1_add(rop,rop,&local_240,ctx);
        }
        uVar3 = uVar3 - 5;
        G1_double(rop,rop,ctx);
        G1_double(rop,rop,ctx);
        G1_double(rop,rop,ctx);
        G1_double(rop,rop,ctx);
        G1_double(rop,rop,ctx);
      } while (4 < uVar3);
      uVar3 = _booth_recode_w5(local_888[0] * 2 & 0x3e);
      G1_gather_w5(&local_240,local_840,uVar3 >> 1);
      fp_neg(src,dst,ctx->p);
      copy_conditional(dst->d,src->d,(ulong)(uVar3 & 1));
      G1_add(rop,rop,&local_240,ctx);
      goto LAB_0011dc6b;
    }
    iVar2 = BN_num_bits((BIGNUM *)scalar);
    if ((iVar2 < 0x101) && (iVar2 = BN_is_negative(scalar), a = scalar, iVar2 == 0)) {
LAB_0011d808:
      iVar2 = bn_get_top(a);
      uVar11 = 0;
      if (0 < iVar2) {
        do {
          puVar5 = bn_get_words(a);
          *(undefined8 *)((long)local_888 + uVar11) = *(undefined8 *)((long)puVar5 + uVar11);
          uVar11 = uVar11 + 8;
          iVar2 = bn_get_top(a);
        } while ((long)uVar11 < (long)(iVar2 << 3));
      }
      if ((uint)uVar11 < 0x21) {
        memset((void *)((long)local_888 + (uVar11 & 0xffffffff)),0,(ulong)(0x20 - (uint)uVar11) + 1)
        ;
      }
      G1_copy(&local_240,op);
      G1_scatter_w5(local_840,&local_240,1);
      G1_double(&local_1e0,&local_240,ctx);
      G1_scatter_w5(local_840,&local_1e0,2);
      G1_add(&local_180,&local_1e0,&local_240,ctx);
      G1_scatter_w5(local_840,&local_180,3);
      G1_double(&local_1e0,&local_1e0,ctx);
      G1_scatter_w5(local_840,&local_1e0,4);
      G1_double(&local_180,&local_180,ctx);
      G1_scatter_w5(local_840,&local_180,6);
      G1_add(&local_120,&local_1e0,&local_240,ctx);
      G1_scatter_w5(local_840,&local_120,5);
      G1_add(&GStack_c0,&local_180,&local_240,ctx);
      G1_scatter_w5(local_840,&GStack_c0,7);
      G1_double(&local_1e0,&local_1e0,ctx);
      G1_scatter_w5(local_840,&local_1e0,8);
      G1_double(&local_180,&local_180,ctx);
      G1_scatter_w5(local_840,&local_180,0xc);
      G1_double(&local_120,&local_120,ctx);
      G1_scatter_w5(local_840,&local_120,10);
      G1_double(&GStack_c0,&GStack_c0,ctx);
      G1_scatter_w5(local_840,&GStack_c0,0xe);
      G1_add(&local_180,&local_180,&local_240,ctx);
      G1_scatter_w5(local_840,&local_180,0xd);
      G1_add(&local_120,&local_120,&local_240,ctx);
      G1_scatter_w5(local_840,&local_120,0xb);
      G1_add(&GStack_c0,&GStack_c0,&local_240,ctx);
      G1_scatter_w5(local_840,&GStack_c0,0xf);
      G1_add(&local_180,&local_1e0,&local_240,ctx);
      G1_scatter_w5(local_840,&local_180,9);
      G1_double(&local_1e0,&local_1e0,ctx);
      G1_scatter_w5(local_840,&local_1e0,0x10);
      cVar1 = '\0';
    }
    else {
      r = BN_CTX_get(ctx_00);
      if (r == (BIGNUM *)0x0) {
        cVar1 = '\x05';
        bVar6 = false;
        a = (BIGNUM *)pBVar10;
      }
      else {
        iVar2 = BN_nnmod(r,(BIGNUM *)scalar,(BIGNUM *)ctx->order,ctx_00);
        bVar12 = iVar2 == 0;
        bVar6 = !bVar12;
        if (!bVar12) {
          pBVar10 = r;
        }
        cVar1 = bVar12 * '\x05';
        a = (BIGNUM *)pBVar10;
      }
      if (bVar6) goto LAB_0011d808;
    }
    bVar6 = false;
    pBVar10 = (BIGNUM *)a;
  } while (cVar1 == '\0');
  if (cVar1 == '\x05') {
LAB_0011dc6b:
    BN_CTX_free(ctx_00);
  }
  return;
}

Assistant:

void G1_mul(G1 *rop, const G1 *op, const BIGNUM *scalar, const ATE_CTX *ctx)
{
    // int i;
    // G1 r;
    // G1_set(&r, op);

    // for(i = BN_num_bits(scalar) - 1; i > 0; i--)
    // {
    //     G1_double(&r, &r, ctx);
    //     if(BN_is_bit_set(scalar, i - 1)) 
    //     {
    //         G1_add(&r, &r, op, ctx);
    //     }
    // }
    // G1_set(rop, &r);
    G1_windowed_mul(rop, scalar, op, ctx);
}